

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int saveGlobal(void *ptr,mpt_path *p,mpt_value *val,int last,int curr)

{
  mpt_config *cfg;
  int curr_local;
  int last_local;
  mpt_value *val_local;
  mpt_path *p_local;
  void *ptr_local;
  
  if ((curr & 3U) == 3) {
    ptr_local._4_4_ = (**(code **)(*ptr + 8))(ptr,p,val);
    if (ptr_local._4_4_ < 0) {
      mpt_log((mpt_logger *)0x0,"mpt_init::TypeConfig",3,"%s","failed to set global config element")
      ;
    }
    else {
      ptr_local._4_4_ = 0;
    }
  }
  else {
    ptr_local._4_4_ = 0;
  }
  return ptr_local._4_4_;
}

Assistant:

static int saveGlobal(void *ptr, const MPT_STRUCT(path) *p, const MPT_STRUCT(value) *val, int last, int curr)
{
	MPT_INTERFACE(config) *cfg = ptr;
	
	if ((curr & 0x3) != MPT_PARSEFLAG(Option)) {
		return 0;
	}
	if ((last = cfg->_vptr->assign(cfg, p, val)) < 0) {
		mpt_log(0, "mpt_init::TypeConfig", MPT_LOG(Error), "%s",
		        MPT_tr("failed to set global config element"));
		return last;
	}
	return 0;
}